

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetTriHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  bool bVar1;
  element_type *peVar2;
  Error *aError;
  ErrorCode local_cc;
  Error local_c8;
  undefined1 local_90 [8];
  BbrDataset bbrDataset;
  string *aHostname_local;
  CommissionerApp *this_local;
  Error *error;
  
  bbrDataset._103_1_ = 0;
  Error::Error(__return_storage_ptr__);
  BbrDataset::BbrDataset((BbrDataset *)local_90);
  std::__cxx11::string::operator=((string *)local_90,(string *)aHostname);
  bbrDataset.mRegistrarIpv6Addr.field_2._8_2_ = bbrDataset.mRegistrarIpv6Addr.field_2._8_2_ | 0x8000
  ;
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x16])(&local_c8,peVar2,local_90);
  aError = Error::operator=(__return_storage_ptr__,&local_c8);
  local_cc = kNone;
  bVar1 = commissioner::operator!=(aError,&local_cc);
  Error::~Error(&local_c8);
  if (!bVar1) {
    MergeDataset(&this->mBbrDataset,(BbrDataset *)local_90);
  }
  bbrDataset._103_1_ = 1;
  BbrDataset::~BbrDataset((BbrDataset *)local_90);
  if ((bbrDataset._103_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetTriHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;

    bbrDataset.mTriHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kTriHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));

    MergeDataset(mBbrDataset, bbrDataset);

exit:
    return error;
}